

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picklpf.c
# Opt level: O3

void av1_pick_filter_level(YV12_BUFFER_CONFIG *sd,AV1_COMP *cpi,LPF_PICK_METHOD method)

{
  uint8_t uVar1;
  LOOPFILTER_CONTROL LVar2;
  int iVar3;
  uint uVar4;
  aom_bit_depth_t aVar5;
  SequenceHeader *pSVar6;
  AV1_PRIMARY *pAVar7;
  RefCntBuffer *pRVar8;
  bool bVar9;
  uint uVar10;
  byte bVar11;
  int16_t iVar12;
  int iVar13;
  int iVar14;
  int64_t iVar15;
  sbyte sVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  int64_t best_filter_sse [3];
  int64_t zero_filter_sse [3];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  int64_t local_58 [2];
  undefined1 local_48 [16];
  undefined8 local_38;
  
  pSVar6 = (cpi->common).seq_params;
  uVar1 = pSVar6->monochrome;
  iVar13 = 0;
  if ((cpi->oxcf).mode == '\x02') {
    iVar13 = (cpi->oxcf).algo_cfg.sharpness;
  }
  (cpi->common).lf.sharpness_level = iVar13;
  if (((((((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) &&
         ((cpi->oxcf).q_cfg.aq_mode == '\x03')) && ((cpi->sf).rt_sf.skip_lf_screen != 0)) &&
       (iVar13 = av1_cyclic_refresh_disable_lf_cdef(cpi), iVar13 != 0)) ||
      ((LVar2 = (cpi->oxcf).algo_cfg.loopfilter_control, LVar2 == LOOPFILTER_NONE ||
       ((LVar2 == LOOPFILTER_REFERENCE && ((cpi->ppi->rtc_ref).non_reference_frame != 0)))))) ||
     (method == '\x04')) {
LAB_001ffa5d:
    (cpi->common).lf.filter_level[0] = 0;
    (cpi->common).lf.filter_level[1] = 0;
    return;
  }
  if (2 < method) {
    uVar19 = 0x3f;
    if (AOM_RC_FIRST_PASS < (cpi->oxcf).pass) {
      uVar19 = (uint)((cpi->ppi->twopass).section_intra_rating < 9) << 4 | 0x2f;
    }
    iVar12 = av1_ac_quant_QTX((cpi->common).quant_params.base_qindex,0,pSVar6->bit_depth);
    uVar18 = 0x2f02;
    if (iVar12 < 1) {
      if ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0) {
        uVar18 = 0x1781;
      }
      else {
        uVar18 = 0x1781;
        if (0x18c00 < (cpi->common).height * (cpi->common).width) {
          uVar18 = 0x2f02;
        }
      }
    }
    if (((((cpi->svc).number_temporal_layers < 2) || ((cpi->svc).temporal_layer_id != 0)) ||
        (0x18c00 < (cpi->common).height * (cpi->common).width)) ||
       ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0)) {
      uVar18 = uVar18 << ((cpi->sf).rt_sf.use_fast_fixed_part != 0);
    }
    else {
      uVar24 = (cpi->rc).frame_source_sad;
      if (uVar24 < 0x186a1) {
        if (50000 < uVar24) {
          uVar18 = (uVar18 >> 1) * 3;
        }
      }
      else {
        uVar18 = uVar18 * 2;
      }
    }
    iVar13 = (int)iVar12;
    aVar5 = pSVar6->bit_depth;
    if (aVar5 == AOM_BITS_8) {
      bVar11 = (cpi->common).current_frame.frame_type;
      iVar14 = uVar18 * iVar13 + 0xbedd3;
      if (bVar11 == 0) {
        iVar14 = iVar13 * 0x449b + -0x46ec6;
      }
      uVar18 = iVar14 >> 0x12;
    }
    else {
      if (aVar5 == AOM_BITS_10) {
        sVar16 = 0x14;
        iVar14 = 0x45f5d8;
      }
      else {
        if (aVar5 != AOM_BITS_12) {
          return;
        }
        sVar16 = 0x16;
        iVar14 = 0x117d75e;
      }
      uVar20 = iVar13 * 0x50f3 + iVar14 >> sVar16;
      bVar11 = (cpi->common).current_frame.frame_type;
      uVar18 = uVar20 - 4;
      if (bVar11 != 0) {
        uVar18 = uVar20;
      }
    }
    if ((int)uVar18 < (int)uVar19) {
      uVar19 = uVar18;
    }
    uVar20 = 0;
    if (-1 < (int)uVar18) {
      uVar20 = uVar19;
    }
    (cpi->common).lf.filter_level[0] = uVar20;
    (cpi->common).lf.filter_level[1] = uVar20;
    (cpi->common).lf.filter_level_u = uVar20;
    (cpi->common).lf.filter_level_v = uVar20;
    if ((bVar11 & 0xfd) == 0 || (cpi->oxcf).algo_cfg.loopfilter_control != LOOPFILTER_SELECTIVELY) {
      return;
    }
    if ((cpi->rc).high_source_sad != 0) {
      return;
    }
    if ((cpi->oxcf).tune_cfg.content != AOM_CONTENT_SCREEN) {
      if (6 < ((cpi->td).rd_counts.newmv_or_intra_blocks * 100) /
              (((cpi->common).height >> 2) * ((cpi->common).width >> 2))) {
        return;
      }
      if ((cpi->rc).frames_since_key < 6) {
        return;
      }
    }
    goto LAB_001ffa5d;
  }
  local_78 = (undefined1  [16])0x0;
  if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
    pAVar7 = cpi->ppi;
    local_78._0_4_ = pAVar7->filter_level[0];
    local_78._4_4_ = pAVar7->filter_level[1];
    local_78._8_4_ = pAVar7->filter_level_u;
    local_78._12_4_ = pAVar7->filter_level_v;
  }
  iVar13 = aom_realloc_frame_buffer
                     (&cpi->last_frame_uf,(cpi->common).width,(cpi->common).height,
                      pSVar6->subsampling_x,pSVar6->subsampling_y,(uint)pSVar6->use_highbitdepth,
                      (cpi->oxcf).border_in_pixels,(cpi->common).features.byte_alignment,
                      (aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,
                      false,0);
  if (iVar13 != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate last frame buffer");
  }
  uVar19 = (uint)(uVar1 == '\0') * 2 + 1;
  local_48 = (undefined1  [16])0x0;
  local_38 = 0;
  local_58[0] = 0;
  local_68 = (undefined1  [16])0x0;
  if (0 < (cpi->sf).lpf_sf.skip_loop_filter_using_filt_error) {
    uVar24 = 0;
    do {
      iVar15 = aom_get_sse_plane(sd,&((cpi->common).cur_frame)->buf,(int)uVar24,
                                 (uint)((cpi->common).seq_params)->use_highbitdepth);
      *(int64_t *)(local_48 + uVar24 * 8) = iVar15;
      uVar24 = uVar24 + 1;
    } while (uVar19 != uVar24);
  }
  uVar18 = (uint)(method == '\x02');
  iVar13 = search_filter_level(sd,cpi,uVar18,(int *)local_78,0,2,(int64_t *)local_68);
  (cpi->common).lf.filter_level[1] = iVar13;
  (cpi->common).lf.filter_level[0] = iVar13;
  if (method != '\x01') {
    iVar13 = search_filter_level(sd,cpi,uVar18,(int *)local_78,0,0,(int64_t *)local_68);
    (cpi->common).lf.filter_level[0] = iVar13;
    iVar13 = search_filter_level(sd,cpi,uVar18,(int *)local_78,0,1,(int64_t *)local_68);
    (cpi->common).lf.filter_level[1] = iVar13;
  }
  if (uVar1 == '\0') {
    iVar13 = search_filter_level(sd,cpi,uVar18,(int *)local_78,1,0,(int64_t *)(local_68 + 8));
    (cpi->common).lf.filter_level_u = iVar13;
    iVar14 = search_filter_level(sd,cpi,uVar18,(int *)local_78,2,0,local_58);
    (cpi->common).lf.filter_level_v = iVar14;
    iVar13 = (cpi->common).lf.filter_level[1];
  }
  else {
    iVar14 = (cpi->common).lf.filter_level_v;
  }
  iVar17 = (cpi->common).lf.filter_level[0];
  iVar3 = (cpi->common).lf.filter_level_u;
  (cpi->common).lf.backup_filter_level[0] = iVar17;
  (cpi->common).lf.backup_filter_level[1] = iVar13;
  (cpi->common).lf.backup_filter_level_u = iVar3;
  (cpi->common).lf.backup_filter_level_v = iVar14;
  if ((cpi->sf).lpf_sf.adaptive_luma_loop_filter_skip < 1) {
LAB_001ffdf3:
    if (iVar17 != 0) {
      if ((iVar13 == 0) || ((cpi->sf).lpf_sf.skip_loop_filter_using_filt_error < 1))
      goto LAB_001ffe62;
      bVar9 = true;
      uVar24 = 0;
      do {
        bVar9 = (bool)(bVar9 & ((double)(*(long *)(local_48 + uVar24 * 8) - local_58[uVar24 - 2]) *
                               100.0) / (double)*(long *)(local_48 + uVar24 * 8) < 2.0);
        uVar24 = uVar24 + 1;
      } while (uVar19 != uVar24);
      if (!bVar9) goto LAB_001ffe62;
      goto LAB_001ffe55;
    }
  }
  else {
    uVar18 = 0x3f;
    uVar20 = 0x3f;
    lVar22 = 0;
    do {
      lVar23 = (long)(cpi->common).remapped_ref_idx[lVar22];
      if ((lVar23 != -1) &&
         (pRVar8 = (cpi->common).ref_frame_map[lVar23], pRVar8 != (RefCntBuffer *)0x0)) {
        uVar4 = pRVar8->filter_level[0];
        uVar10 = pRVar8->filter_level[1];
        uVar18 = uVar18 & -(uint)(uVar4 == 0xffffffff) |
                 ~-(uint)(uVar4 == 0xffffffff) &
                 (~-(uint)((int)uVar18 < (int)uVar4) & uVar4 |
                 uVar18 & -(uint)((int)uVar18 < (int)uVar4));
        uVar20 = uVar20 & -(uint)(uVar10 == 0xffffffff) |
                 ~-(uint)(uVar10 == 0xffffffff) &
                 (~-(uint)((int)uVar20 < (int)uVar10) & uVar10 |
                 uVar20 & -(uint)((int)uVar20 < (int)uVar10));
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 7);
    uVar4 = (cpi->common).current_frame.pyramid_level;
    if (uVar4 < 2) goto LAB_001ffdf3;
    iVar21 = 0x20;
    if (uVar4 < 5) {
      iVar21 = (uint)(uVar4 == 4) * 8 + 8;
    }
    if ((iVar21 <= iVar3 || (iVar21 <= iVar13 || iVar21 <= iVar17)) || (iVar21 <= iVar14))
    goto LAB_001ffdf3;
    auVar25._0_4_ = -(uint)(uVar18 == 0);
    auVar25._4_4_ = -(uint)(uVar18 == 0);
    auVar25._8_4_ = -(uint)(uVar20 == 0);
    auVar25._12_4_ = -(uint)(uVar20 == 0);
    uVar18 = movmskpd(iVar14,auVar25);
    if (((uVar18 & 1) == 0) || ((byte)((byte)uVar18 >> 1) == 0)) goto LAB_001ffdf3;
LAB_001ffe55:
    (cpi->common).lf.filter_level[0] = 0;
    (cpi->common).lf.filter_level[1] = 0;
  }
  iVar17 = 0;
LAB_001ffe62:
  pRVar8 = (cpi->common).cur_frame;
  pRVar8->filter_level[0] = iVar17;
  pRVar8->filter_level[1] = (cpi->common).lf.filter_level[1];
  return;
}

Assistant:

void av1_pick_filter_level(const YV12_BUFFER_CONFIG *sd, AV1_COMP *cpi,
                           LPF_PICK_METHOD method) {
  AV1_COMMON *const cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  const int num_planes = av1_num_planes(cm);
  struct loopfilter *const lf = &cm->lf;
  int disable_filter_rt_screen = 0;
  (void)sd;

  // Enable loop filter sharpness only for allintra encoding mode,
  // as frames do not have to serve as references to others
  lf->sharpness_level =
      cpi->oxcf.mode == ALLINTRA ? cpi->oxcf.algo_cfg.sharpness : 0;

  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN &&
      cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
      cpi->sf.rt_sf.skip_lf_screen)
    disable_filter_rt_screen = av1_cyclic_refresh_disable_lf_cdef(cpi);

  if (disable_filter_rt_screen ||
      cpi->oxcf.algo_cfg.loopfilter_control == LOOPFILTER_NONE ||
      (cpi->oxcf.algo_cfg.loopfilter_control == LOOPFILTER_REFERENCE &&
       cpi->ppi->rtc_ref.non_reference_frame)) {
    lf->filter_level[0] = 0;
    lf->filter_level[1] = 0;
    return;
  }

  if (method == LPF_PICK_MINIMAL_LPF) {
    lf->filter_level[0] = 0;
    lf->filter_level[1] = 0;
  } else if (method >= LPF_PICK_FROM_Q) {
    const int min_filter_level = 0;
    const int max_filter_level = get_max_filter_level(cpi);
    const int q = av1_ac_quant_QTX(cm->quant_params.base_qindex, 0,
                                   seq_params->bit_depth);
    // based on tests result for rtc test set
    // 0.04590 boosted or 0.02295 non-booseted in 18-bit fixed point
    const int strength_boost_q_treshold = 0;
    int inter_frame_multiplier =
        (q > strength_boost_q_treshold ||
         (cpi->sf.rt_sf.use_nonrd_pick_mode &&
          cpi->common.width * cpi->common.height > 352 * 288))
            ? 12034
            : 6017;
    // Increase strength on base TL0 for temporal layers, for low-resoln,
    // based on frame source_sad.
    if (cpi->svc.number_temporal_layers > 1 &&
        cpi->svc.temporal_layer_id == 0 &&
        cpi->common.width * cpi->common.height <= 352 * 288 &&
        cpi->sf.rt_sf.use_nonrd_pick_mode) {
      if (cpi->rc.frame_source_sad > 100000)
        inter_frame_multiplier = inter_frame_multiplier << 1;
      else if (cpi->rc.frame_source_sad > 50000)
        inter_frame_multiplier = 3 * (inter_frame_multiplier >> 1);
    } else if (cpi->sf.rt_sf.use_fast_fixed_part) {
      inter_frame_multiplier = inter_frame_multiplier << 1;
    }
    // These values were determined by linear fitting the result of the
    // searched level for 8 bit depth:
    // Keyframes: filt_guess = q * 0.06699 - 1.60817
    // Other frames: filt_guess = q * inter_frame_multiplier + 2.48225
    //
    // And high bit depth separately:
    // filt_guess = q * 0.316206 + 3.87252
    int filt_guess;
    switch (seq_params->bit_depth) {
      case AOM_BITS_8:
        filt_guess =
            (cm->current_frame.frame_type == KEY_FRAME)
                ? ROUND_POWER_OF_TWO(q * 17563 - 421574, 18)
                : ROUND_POWER_OF_TWO(q * inter_frame_multiplier + 650707, 18);
        break;
      case AOM_BITS_10:
        filt_guess = ROUND_POWER_OF_TWO(q * 20723 + 4060632, 20);
        break;
      case AOM_BITS_12:
        filt_guess = ROUND_POWER_OF_TWO(q * 20723 + 16242526, 22);
        break;
      default:
        assert(0 &&
               "bit_depth should be AOM_BITS_8, AOM_BITS_10 "
               "or AOM_BITS_12");
        return;
    }
    if (seq_params->bit_depth != AOM_BITS_8 &&
        cm->current_frame.frame_type == KEY_FRAME)
      filt_guess -= 4;
    // TODO(chengchen): retrain the model for Y, U, V filter levels
    lf->filter_level[0] = clamp(filt_guess, min_filter_level, max_filter_level);
    lf->filter_level[1] = clamp(filt_guess, min_filter_level, max_filter_level);
    lf->filter_level_u = clamp(filt_guess, min_filter_level, max_filter_level);
    lf->filter_level_v = clamp(filt_guess, min_filter_level, max_filter_level);
    if (cpi->oxcf.algo_cfg.loopfilter_control == LOOPFILTER_SELECTIVELY &&
        !frame_is_intra_only(cm) && !cpi->rc.high_source_sad) {
      if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN) {
        lf->filter_level[0] = 0;
        lf->filter_level[1] = 0;
      } else {
        const int num4x4 = (cm->width >> 2) * (cm->height >> 2);
        const int newmv_thresh = 7;
        const int distance_since_key_thresh = 5;
        if ((cpi->td.rd_counts.newmv_or_intra_blocks * 100 / num4x4) <
                newmv_thresh &&
            cpi->rc.frames_since_key > distance_since_key_thresh) {
          lf->filter_level[0] = 0;
          lf->filter_level[1] = 0;
        }
      }
    }
  } else {
    int last_frame_filter_level[4] = { 0 };
    if (!frame_is_intra_only(cm)) {
      last_frame_filter_level[0] = cpi->ppi->filter_level[0];
      last_frame_filter_level[1] = cpi->ppi->filter_level[1];
      last_frame_filter_level[2] = cpi->ppi->filter_level_u;
      last_frame_filter_level[3] = cpi->ppi->filter_level_v;
    }
    // The frame buffer last_frame_uf is used to store the non-loop filtered
    // reconstructed frame in search_filter_level().
    if (aom_realloc_frame_buffer(
            &cpi->last_frame_uf, cm->width, cm->height,
            seq_params->subsampling_x, seq_params->subsampling_y,
            seq_params->use_highbitdepth, cpi->oxcf.border_in_pixels,
            cm->features.byte_alignment, NULL, NULL, NULL, false, 0))
      aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate last frame buffer");

    int64_t zero_filter_sse[MAX_MB_PLANE] = { 0 };
    int64_t best_filter_sse[MAX_MB_PLANE] = { 0 };

    if (cpi->sf.lpf_sf.skip_loop_filter_using_filt_error >= 1) {
      for (int plane = 0; plane < num_planes; plane++) {
        zero_filter_sse[plane] = aom_get_sse_plane(
            sd, &cm->cur_frame->buf, plane, cm->seq_params->use_highbitdepth);
      }
    }

    lf->filter_level[0] = lf->filter_level[1] =
        search_filter_level(sd, cpi, method == LPF_PICK_FROM_SUBIMAGE,
                            last_frame_filter_level, 0, 2, &best_filter_sse[0]);
    if (method != LPF_PICK_FROM_FULL_IMAGE_NON_DUAL) {
      lf->filter_level[0] = search_filter_level(
          sd, cpi, method == LPF_PICK_FROM_SUBIMAGE, last_frame_filter_level, 0,
          0, &best_filter_sse[0]);
      lf->filter_level[1] = search_filter_level(
          sd, cpi, method == LPF_PICK_FROM_SUBIMAGE, last_frame_filter_level, 0,
          1, &best_filter_sse[0]);
    }

    if (num_planes > 1) {
      lf->filter_level_u = search_filter_level(
          sd, cpi, method == LPF_PICK_FROM_SUBIMAGE, last_frame_filter_level, 1,
          0, &best_filter_sse[1]);
      lf->filter_level_v = search_filter_level(
          sd, cpi, method == LPF_PICK_FROM_SUBIMAGE, last_frame_filter_level, 2,
          0, &best_filter_sse[2]);
    }

    lf->backup_filter_level[0] = lf->filter_level[0];
    lf->backup_filter_level[1] = lf->filter_level[1];
    lf->backup_filter_level_u = lf->filter_level_u;
    lf->backup_filter_level_v = lf->filter_level_v;

    if (cpi->sf.lpf_sf.adaptive_luma_loop_filter_skip >= 1) {
      int32_t min_ref_filter_level[2] = { MAX_LOOP_FILTER, MAX_LOOP_FILTER };
      // Find the minimum luma filter levels across all reference frames.
      for (int ref = LAST_FRAME; ref <= ALTREF_FRAME; ++ref) {
        const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref);
        if (buf == NULL) continue;

        if (buf->filter_level[0] != -1)
          min_ref_filter_level[0] =
              AOMMIN(min_ref_filter_level[0], buf->filter_level[0]);
        if (buf->filter_level[1] != -1)
          min_ref_filter_level[1] =
              AOMMIN(min_ref_filter_level[1], buf->filter_level[1]);
      }

      // Reset luma filter levels to zero based on minimum filter levels of
      // reference frames and current frame's pyramid level.
      unsigned int pyramid_level = cm->current_frame.pyramid_level;
      if (pyramid_level > 1) {
        int filter_threshold;
        if (pyramid_level >= 5)
          filter_threshold = 32;
        else if (pyramid_level >= 4)
          filter_threshold = 16;
        else
          filter_threshold = 8;

        const bool reset_filter_level_y =
            lf->filter_level[0] < filter_threshold &&
            lf->filter_level[1] < filter_threshold &&
            lf->filter_level_u < filter_threshold &&
            lf->filter_level_v < filter_threshold &&
            min_ref_filter_level[0] == 0 && min_ref_filter_level[1] == 0;
        if (reset_filter_level_y) {
          lf->filter_level[0] = 0;
          lf->filter_level[1] = 0;
        }
      }
    }

    if (lf->filter_level[0] != 0 && lf->filter_level[1] != 0 &&
        cpi->sf.lpf_sf.skip_loop_filter_using_filt_error >= 1) {
      const double pct_improvement_thresh = 2.0;
      bool reset_filter_level_y = true;

      // Calculate the percentage improvement in SSE for each plane. This
      // measures the relative reduction in error when applying the filter
      // compared to no filtering.
      for (int plane = 0; plane < num_planes; plane++) {
        const double pct_improvement_sse =
            ((zero_filter_sse[plane] - best_filter_sse[plane]) * 100.0) /
            zero_filter_sse[plane];
        reset_filter_level_y &= pct_improvement_sse < pct_improvement_thresh;
      }

      if (reset_filter_level_y) {
        lf->filter_level[0] = 0;
        lf->filter_level[1] = 0;
      }
    }

    // Store the current frame's filter levels to be referenced
    // while determining the minimum filter level from reference frames.
    cm->cur_frame->filter_level[0] = lf->filter_level[0];
    cm->cur_frame->filter_level[1] = lf->filter_level[1];
  }
}